

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateConstexprString
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *structName)

{
  bool bVar1;
  bool bVar2;
  char *__rhs;
  bool local_82;
  byte local_60;
  allocator<char> local_5e;
  byte local_5d;
  byte local_4a;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_21;
  string *psStack_20;
  bool isConstExpression;
  string *structName_local;
  VulkanHppGenerator *this_local;
  
  psStack_20 = structName;
  structName_local = &this->m_api;
  this_local = (VulkanHppGenerator *)__return_storage_ptr__;
  bVar1 = std::operator==(structName,"VkBaseInStructure");
  local_60 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = std::operator==(psStack_20,"VkBaseOutStructure");
    local_60 = bVar1 ^ 0xff;
  }
  local_21 = local_60 & 1;
  local_4a = 0;
  local_5d = 0;
  bVar1 = false;
  if (local_21 == 0) {
    std::allocator<char>::allocator();
    bVar1 = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_5e);
  }
  else {
    std::allocator<char>::allocator();
    local_4a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"VULKAN_HPP_CONSTEXPR",&local_49);
    local_5d = 1;
    bVar2 = containsUnion(this,psStack_20);
    local_82 = true;
    if (!bVar2) {
      local_82 = containsArray(this,psStack_20);
    }
    __rhs = " ";
    if (local_82 != false) {
      __rhs = "_14 ";
    }
    std::operator+(__return_storage_ptr__,&local_48,__rhs);
  }
  if (bVar1) {
    std::allocator<char>::~allocator(&local_5e);
  }
  if ((local_5d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((local_4a & 1) != 0) {
    std::allocator<char>::~allocator(&local_49);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateConstexprString( std::string const & structName ) const
{
  // structs with a VkBaseInStructure and VkBaseOutStructure can't be a constexpr!
  const bool isConstExpression = ( structName != "VkBaseInStructure" ) && ( structName != "VkBaseOutStructure" );
  return isConstExpression ? ( std::string( "VULKAN_HPP_CONSTEXPR" ) + ( ( containsUnion( structName ) || containsArray( structName ) ) ? "_14 " : " " ) ) : "";
}